

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_MergeFromString_Test::
~RepeatedPtrFieldTest_MergeFromString_Test(RepeatedPtrFieldTest_MergeFromString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, MergeFromString) {
  RepeatedPtrField<std::string> source, destination;
  source.Add()->assign("4");
  source.Add()->assign("5");
  destination.Add()->assign("1");
  destination.Add()->assign("2");
  destination.Add()->assign("3");

  destination.MergeFrom(source);

  ASSERT_EQ(5, destination.size());
  EXPECT_EQ("1", destination.Get(0));
  EXPECT_EQ("2", destination.Get(1));
  EXPECT_EQ("3", destination.Get(2));
  EXPECT_EQ("4", destination.Get(3));
  EXPECT_EQ("5", destination.Get(4));

  destination.Clear();

  ASSERT_EQ(0, destination.size());

  destination.MergeFrom(source);

  ASSERT_EQ(2, destination.size());
  EXPECT_EQ("4", destination.Get(0));
  EXPECT_EQ("5", destination.Get(1));

  delete destination.ReleaseLast();

  ASSERT_EQ(1, destination.size());
  EXPECT_EQ("4", destination.Get(0));

  destination.MergeFrom(source);

  ASSERT_EQ(3, destination.size());
  EXPECT_EQ("4", destination.Get(0));
  EXPECT_EQ("4", destination.Get(1));
  EXPECT_EQ("5", destination.Get(2));
}